

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O2

ASN1_STRING * ASN1_STRING_type_new(int type)

{
  ASN1_STRING *pAVar1;
  
  pAVar1 = (ASN1_STRING *)OPENSSL_malloc(0x18);
  if (pAVar1 != (ASN1_STRING *)0x0) {
    pAVar1->length = 0;
    pAVar1->type = type;
    pAVar1->data = (uchar *)0x0;
    pAVar1->flags = 0;
  }
  return pAVar1;
}

Assistant:

ASN1_STRING *ASN1_STRING_type_new(int type) {
  ASN1_STRING *ret;

  ret = (ASN1_STRING *)OPENSSL_malloc(sizeof(ASN1_STRING));
  if (ret == NULL) {
    return NULL;
  }
  ret->length = 0;
  ret->type = type;
  ret->data = NULL;
  ret->flags = 0;
  return ret;
}